

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall
o3dgc::Arithmetic_Codec::encode(Arithmetic_Codec *this,uint bit,Adaptive_Bit_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint init_base;
  uint x;
  Adaptive_Bit_Model *M_local;
  uint bit_local;
  Arithmetic_Codec *this_local;
  
  uVar2 = M->bit_0_prob * (this->length >> 0xd);
  if (bit == 0) {
    this->length = uVar2;
    M->bit_0_count = M->bit_0_count + 1;
  }
  else {
    uVar1 = this->base;
    this->base = uVar2 + this->base;
    this->length = this->length - uVar2;
    if (this->base < uVar1) {
      propagate_carry(this);
    }
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
  }
  uVar2 = M->bits_until_update - 1;
  M->bits_until_update = uVar2;
  if (uVar2 == 0) {
    Adaptive_Bit_Model::update(M);
  }
  return;
}

Assistant:

void Arithmetic_Codec::encode(unsigned bit,
                                  Adaptive_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 1) AC_Error("encoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
                                                                // update interval
      if (bit == 0) {
        length = x;
        ++M.bit_0_count;
      }
      else {
        unsigned init_base = base;
        base   += x;
        length -= x;
        if (init_base > base) propagate_carry();               // overflow = carry
      }

      if (length < AC__MinLength) renorm_enc_interval();        // renormalization

      if (--M.bits_until_update == 0) M.update();         // periodic model update
    }